

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

bool __thiscall helics::CoreBroker::isOpenToNewFederates(CoreBroker *this)

{
  bool bVar1;
  BrokerState BVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  CoreBroker *unaff_retaddr;
  BrokerState cstate;
  undefined6 in_stack_ffffffffffffffe8;
  
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5d906c);
  if (OPERATING < BVar2) {
    return false;
  }
  iVar4 = *(int *)(in_RDI + 0x28);
  iVar3 = CLI::std::numeric_limits<int>::max();
  if (((iVar4 == iVar3) ||
      (iVar4 = getCountableFederates(unaff_retaddr), iVar4 < *(int *)(in_RDI + 0x28))) &&
     (bVar1 = std::atomic::operator_cast_to_bool
                        ((atomic<bool> *)CONCAT26(BVar2,in_stack_ffffffffffffffe8)), !bVar1)) {
    if ((*(byte *)(in_RDI + 0xdf) & 1) == 0) {
      return BVar2 < OPERATING;
    }
    return true;
  }
  return false;
}

Assistant:

bool CoreBroker::isOpenToNewFederates() const
{
    auto cstate = getBrokerState();
    if (cstate > BrokerState::OPERATING) {
        return false;
    }
    if ((maxFederateCount == (std::numeric_limits<int32_t>::max)() ||
         getCountableFederates() < maxFederateCount) &&
        !haltOperations) {
        if (!dynamicFederation) {
            return (cstate < BrokerState::OPERATING);
        }
        return true;
    }
    return false;
}